

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_map.h
# Opt level: O0

pair<ctemplate::small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>::iterator,_bool>
* __thiscall
ctemplate::
small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>
::insert(pair<ctemplate::small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>::iterator,_bool>
         *__return_storage_ptr__,
        small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>
        *this,value_type *x)

{
  int iVar1;
  bool bVar2;
  pair<const_unsigned_long,_ctemplate::TemplateString> *__x;
  map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>
  *pmVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>,_bool>
  pVar4;
  iterator local_b0;
  _Base_ptr local_a0;
  undefined1 local_98;
  iterator local_90;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>,_bool>
  ret_1;
  iterator local_78;
  iterator local_68;
  _Base_ptr local_58;
  undefined1 local_50;
  iterator local_48;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>,_bool> ret
  ;
  iterator local_30;
  int local_20;
  equal_to<unsigned_long> local_19;
  int i;
  key_equal compare;
  value_type *x_local;
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>
  *this_local;
  
  _i = x;
  if (this->size_ < 0) {
    pmVar3 = ManualConstructor<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>
             ::operator->(&(this->field_2).map_);
    pVar4 = std::
            map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>
            ::insert(pmVar3,_i);
    local_a0 = (_Base_ptr)pVar4.first._M_node;
    local_98 = pVar4.second;
    local_90._M_node = local_a0;
    ret_1.first._M_node._0_1_ = local_98;
    iterator::iterator(&local_b0,&local_90);
    std::
    make_pair<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>,4,std::equal_to<unsigned_long>,ctemplate::small_map_default_init<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>>>::iterator,bool&>
              (__return_storage_ptr__,&local_b0,(bool *)&ret_1);
  }
  else {
    for (local_20 = 0; local_20 < this->size_; local_20 = local_20 + 1) {
      __x = ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>::
            operator->((ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>
                        *)((long)&this->field_2 + (long)local_20 * 0x28));
      bVar2 = std::equal_to<unsigned_long>::operator()(&local_19,&__x->first,&_i->first);
      if (bVar2) {
        iterator::iterator(&local_30,
                           (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>
                            *)((long)&this->field_2 + (long)local_20 * 0x28));
        ret._15_1_ = 0;
        std::
        make_pair<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>,4,std::equal_to<unsigned_long>,ctemplate::small_map_default_init<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>>>::iterator,bool>
                  (__return_storage_ptr__,&local_30,(bool *)&ret.field_0xf);
        return __return_storage_ptr__;
      }
    }
    if (this->size_ == 4) {
      ConvertToRealMap(this);
      pmVar3 = ManualConstructor<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>
               ::operator->(&(this->field_2).map_);
      pVar4 = std::
              map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>
              ::insert(pmVar3,_i);
      local_58 = (_Base_ptr)pVar4.first._M_node;
      local_50 = pVar4.second;
      local_48._M_node = local_58;
      ret.first._M_node._0_1_ = local_50;
      iterator::iterator(&local_68,&local_48);
      std::
      make_pair<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>,4,std::equal_to<unsigned_long>,ctemplate::small_map_default_init<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>>>::iterator,bool&>
                (__return_storage_ptr__,&local_68,(bool *)&ret);
    }
    else {
      ManualConstructor<std::pair<unsigned_long_const,ctemplate::TemplateString>>::
      Init<std::pair<unsigned_long_const,ctemplate::TemplateString>>
                ((ManualConstructor<std::pair<unsigned_long_const,ctemplate::TemplateString>> *)
                 ((long)&this->field_2 + (long)this->size_ * 0x28),_i);
      iVar1 = this->size_;
      this->size_ = iVar1 + 1;
      iterator::iterator(&local_78,
                         (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>
                          *)((long)&this->field_2 + (long)iVar1 * 0x28));
      ret_1._15_1_ = 1;
      std::
      make_pair<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>,4,std::equal_to<unsigned_long>,ctemplate::small_map_default_init<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>>>::iterator,bool>
                (__return_storage_ptr__,&local_78,(bool *)&ret_1.field_0xf);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert(const value_type& x) {
    key_equal compare;

    if (size_ >= 0) {
      for (int i = 0; i < size_; i++) {
        if (compare(array_[i]->first, x.first)) {
          return std::make_pair(iterator(array_ + i), false);
        }
      }
      if (size_ == kArraySize) {
        ConvertToRealMap();  // Invalidates all iterators!
        std::pair<typename NormalMap::iterator, bool> ret = map_->insert(x);
        return std::make_pair(iterator(ret.first), ret.second);
      } else {
        array_[size_].Init(x);
        return std::make_pair(iterator(array_ + size_++), true);
      }
    } else {
      std::pair<typename NormalMap::iterator, bool> ret = map_->insert(x);
      return std::make_pair(iterator(ret.first), ret.second);
    }
  }